

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLExportVisitor::visit_(IDLExportVisitor *this,Enum *type)

{
  bool bVar1;
  ostream *poVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  pointer name;
  char (*in_RCX) [3];
  type local_e0;
  string local_c0;
  _Base_ptr local_a0;
  _Self local_98;
  const_iterator end;
  const_iterator it;
  ValueMap *values;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  string local_58;
  string local_38;
  Enum *local_18;
  Enum *type_local;
  IDLExportVisitor *this_local;
  
  local_18 = type;
  type_local = (Enum *)this;
  poVar2 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  poVar2 = std::operator<<(poVar2,"enum ");
  Typelib::Type::getBasename_abi_cxx11_();
  stripLeadingUnderscore(&local_38,&local_58);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2," { ");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&values);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)Typelib::Enum::values_abi_cxx11_();
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&end);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(this_00);
  local_a0 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(this_00);
  end = (const_iterator)local_a0;
  while( true ) {
    bVar1 = std::operator!=(&end,&local_98);
    if (!bVar1) break;
    name = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&end);
    stripLeadingUnderscore(&local_c0,&name->first);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&values,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&end);
  }
  boost::algorithm::
  join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            (&local_e0,(algorithm *)&values,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",in_RCX);
  poVar2 = std::operator<<((ostream *)&this->m_stream,(string *)&local_e0);
  std::operator<<(poVar2," };\n");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&values);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_ (Enum const& type)
    {
        m_stream << m_indent << "enum " << stripLeadingUnderscore(type.getBasename()) << " { ";

        list<string> symbols;
        Enum::ValueMap const& values = type.values();
        Enum::ValueMap::const_iterator it, end = values.end();
        for (it = values.begin(); it != end; ++it)
            symbols.push_back(stripLeadingUnderscore(it->first));
        m_stream << join(symbols, ", ") << " };\n";

        return true;
    }